

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_AddNetwork_Test::TestBody
          (PersistentStorageJsonTestSuite_AddNetwork_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type **ppsVar3;
  size_type **ppsVar4;
  undefined8 *puVar5;
  size_type sVar6;
  Status SVar7;
  char *in_R9;
  char *pcVar8;
  bool bVar9;
  AssertHelper local_130;
  undefined8 *local_128;
  NetworkId newId;
  string local_118;
  DomainId local_f8;
  NetworkId local_f4;
  string local_f0;
  undefined1 local_d0 [56];
  _Alloc_hider local_98;
  size_type *local_88 [3];
  PersistentStorageJson psj;
  
  unlink("./tmp/test.tmp");
  ppsVar3 = (size_type **)(local_d0 + 0x10);
  local_d0._0_8_ = ppsVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&psj,(string *)local_d0);
  if ((size_type **)local_d0._0_8_ != ppsVar3) {
    operator_delete((void *)local_d0._0_8_);
  }
  SVar7 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&psj);
  local_118._M_dataplus._M_p._0_1_ = SVar7 == kSuccess;
  local_118._M_string_length = 0;
  if (SVar7 != kSuccess) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_118,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x7f,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar6 = local_118._M_string_length;
    if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_118._M_string_length !=
          (undefined8 *)(local_118._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_118._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&newId);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_f4,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_f8,0xffffffff);
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"nwk1","");
  paVar2 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"2000:aaa1::0/8","");
  pcVar8 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)local_d0,&local_f4,&local_f8,&local_118,0xfffffffffffffff1,0xb,0xfff1,
             &local_f0,1);
  SVar7 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&psj,(Network *)local_d0,&newId);
  local_130.data_._0_1_ = (internal)(SVar7 == kSuccess);
  local_128 = (undefined8 *)0x0;
  if ((size_type **)local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  ppsVar4 = (size_type **)(local_d0 + 0x18);
  if ((size_type **)local_d0._8_8_ != ppsVar4) {
    operator_delete((void *)local_d0._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_130.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_130,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk1\", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, \"2000:aaa1::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x84,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
    }
  }
  puVar5 = local_128;
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(puVar5);
  }
  local_118._M_dataplus._M_p._0_1_ = newId.mId == 0;
  local_118._M_string_length = 0;
  if (newId.mId != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_118,(AssertionResult *)"newId.mId == 0","false"
               ,"true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x85,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar6 = local_118._M_string_length;
    if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_118._M_string_length !=
          (undefined8 *)(local_118._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_118._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_f4,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_f8,0xffffffff);
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"nwk2","");
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"2000:aaa2::0/8","");
  pcVar8 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)local_d0,&local_f4,&local_f8,&local_118,0xfffffffffffffff2,0xb,0xfff2,
             &local_f0,1);
  SVar7 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&psj,(Network *)local_d0,&newId);
  local_130.data_._0_1_ = (internal)(SVar7 == kSuccess);
  local_128 = (undefined8 *)0x0;
  if ((size_type **)local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  if ((size_type **)local_d0._8_8_ != ppsVar4) {
    operator_delete((void *)local_d0._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_130.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_130,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk2\", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, \"2000:aaa2::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x87,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
    }
  }
  puVar5 = local_128;
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(puVar5);
  }
  local_118._M_dataplus._M_p._0_1_ = newId.mId == 1;
  local_118._M_string_length = 0;
  if (newId.mId != 1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_118,(AssertionResult *)"newId.mId == 1","false"
               ,"true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x88,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar6 = local_118._M_string_length;
    if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_118._M_string_length !=
          (undefined8 *)(local_118._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_118._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_f4,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_f8,0xffffffff);
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"nwk3","");
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"2000:aaa3::0/8","");
  pcVar8 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)local_d0,&local_f4,&local_f8,&local_118,0xfffffffffffffff3,0xb,0xfff3,
             &local_f0,1);
  SVar7 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&psj,(Network *)local_d0,&newId);
  local_130.data_._0_1_ = (internal)(SVar7 == kSuccess);
  local_128 = (undefined8 *)0x0;
  if ((size_type **)local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  if ((size_type **)local_d0._8_8_ != ppsVar4) {
    operator_delete((void *)local_d0._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_130.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_130,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk3\", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, \"2000:aaa3::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x8a,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
    }
  }
  puVar5 = local_128;
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(puVar5);
  }
  bVar9 = newId.mId == 2;
  local_118._M_string_length = 0;
  local_118._M_dataplus._M_p._0_1_ = bVar9;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_118,(AssertionResult *)"newId.mId == 2","false"
               ,"true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x8b,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar6 = local_118._M_string_length;
    if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_118._M_string_length !=
          (undefined8 *)(local_118._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_118._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  SVar7 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&psj);
  local_118._M_dataplus._M_p._0_1_ = SVar7 == kSuccess;
  local_118._M_string_length = 0;
  if (SVar7 != kSuccess) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_118,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x8d,(char *)local_d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type **)local_d0._0_8_ != ppsVar3) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
    }
    sVar6 = local_118._M_string_length;
    if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_118._M_string_length !=
          (undefined8 *)(local_118._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_118._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&psj);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, AddNetwork)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    NetworkId newId;

    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk1", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, "2000:aaa1::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk2", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, "2000:aaa2::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk3", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, "2000:aaa3::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}